

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

char * __thiscall mp::BasicConstraintKeeper::GetShortTypeName(BasicConstraintKeeper *this)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  string *__range2;
  char cVar5;
  string acc_opt;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  if ((this->type_name_short_)._M_string_length == 0) {
    iVar3 = (*this->_vptr_BasicConstraintKeeper[0x1b])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)local_68);
    cVar5 = (char)(string *)local_48;
    std::__cxx11::string::find(cVar5,0x20);
    std::__cxx11::string::find(cVar5,0x3a);
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::string::operator=((string *)&this->type_name_short_,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    sVar1 = (this->type_name_short_)._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (this->type_name_short_)._M_dataplus._M_p;
      sVar4 = 0;
      do {
        if (pcVar2[sVar4] == ':') {
          pcVar2[sVar4] = '_';
        }
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return (this->type_name_short_)._M_dataplus._M_p;
}

Assistant:

const char*
BasicConstraintKeeper::GetShortTypeName() const {
  if (type_name_short_.empty()) {
    std::string acc_opt = GetAcceptanceOptionNames();
    assert(acc_opt.size());
    auto word_end = std::min(acc_opt.find(' '),
                             acc_opt.size());
    auto colon_pos = acc_opt.find(':');
    if (colon_pos>word_end)
      colon_pos = 0;
    type_name_short_ = acc_opt.substr(
        colon_pos, word_end-colon_pos);
    for (auto& c: type_name_short_)
      if (':'==c)
        c = '_';                // Markdown
    assert(type_name_short_.size());
  }
  return type_name_short_.c_str();
}